

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::AddGenerators
          (MessageGenerator *this,
          vector<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
          *enum_generators,
          vector<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
          *extension_generators)

{
  pointer *ppuVar1;
  pointer *pppEVar2;
  pointer *pppEVar3;
  iterator __position;
  iterator __position_00;
  iterator __position_01;
  iterator __position_02;
  vector<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>>>>
  *pvVar4;
  ExtensionGenerator *pEVar5;
  Descriptor *pDVar6;
  long lVar7;
  long lVar8;
  _Head_base<0UL,_google::protobuf::compiler::cpp::ExtensionGenerator_*,_false> local_58;
  vector<google::protobuf::compiler::cpp::ExtensionGenerator_const*,std::allocator<google::protobuf::compiler::cpp::ExtensionGenerator_const*>>
  *local_50;
  vector<google::protobuf::compiler::cpp::EnumGenerator_const*,std::allocator<google::protobuf::compiler::cpp::EnumGenerator_const*>>
  *local_48;
  Options *local_40;
  vector<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>>>>
  *local_38;
  
  pDVar6 = this->descriptor_;
  local_38 = (vector<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>>>>
              *)extension_generators;
  if (0 < *(int *)(pDVar6 + 0x74)) {
    local_50 = (vector<google::protobuf::compiler::cpp::ExtensionGenerator_const*,std::allocator<google::protobuf::compiler::cpp::ExtensionGenerator_const*>>
                *)&this->variables_;
    local_40 = &this->options_;
    local_48 = (vector<google::protobuf::compiler::cpp::EnumGenerator_const*,std::allocator<google::protobuf::compiler::cpp::EnumGenerator_const*>>
                *)&this->enum_generators_;
    lVar7 = 0;
    lVar8 = 0;
    do {
      pEVar5 = (ExtensionGenerator *)operator_new(0x68);
      EnumGenerator::EnumGenerator
                ((EnumGenerator *)pEVar5,(EnumDescriptor *)(*(long *)(pDVar6 + 0x40) + lVar7),
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_50,local_40);
      __position._M_current =
           (enum_generators->
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (enum_generators->
          super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_58._M_head_impl = pEVar5;
        std::
        vector<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>>>>
        ::_M_realloc_insert<google::protobuf::compiler::cpp::EnumGenerator*>
                  ((vector<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>>>>
                    *)enum_generators,__position,(EnumGenerator **)&local_58);
      }
      else {
        ((__position._M_current)->_M_t).
        super___uniq_ptr_impl<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>
        ._M_t.
        super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::EnumGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>
        .super__Head_base<0UL,_google::protobuf::compiler::cpp::EnumGenerator_*,_false>._M_head_impl
             = (EnumGenerator *)pEVar5;
        ppuVar1 = &(enum_generators->
                   super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + 1;
      }
      local_58._M_head_impl =
           (ExtensionGenerator *)
           (enum_generators->
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
           super___uniq_ptr_impl<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::EnumGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>
           .super__Head_base<0UL,_google::protobuf::compiler::cpp::EnumGenerator_*,_false>.
           _M_head_impl;
      __position_00._M_current =
           (this->enum_generators_).
           super__Vector_base<const_google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<const_google::protobuf::compiler::cpp::EnumGenerator_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position_00._M_current ==
          (this->enum_generators_).
          super__Vector_base<const_google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<const_google::protobuf::compiler::cpp::EnumGenerator_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<google::protobuf::compiler::cpp::EnumGenerator_const*,std::allocator<google::protobuf::compiler::cpp::EnumGenerator_const*>>
        ::_M_realloc_insert<google::protobuf::compiler::cpp::EnumGenerator_const*>
                  (local_48,__position_00,(EnumGenerator **)&local_58);
      }
      else {
        *__position_00._M_current = (EnumGenerator *)local_58._M_head_impl;
        pppEVar2 = &(this->enum_generators_).
                    super__Vector_base<const_google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<const_google::protobuf::compiler::cpp::EnumGenerator_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppEVar2 = *pppEVar2 + 1;
      }
      lVar8 = lVar8 + 1;
      pDVar6 = this->descriptor_;
      lVar7 = lVar7 + 0x48;
    } while (lVar8 < *(int *)(pDVar6 + 0x74));
  }
  pDVar6 = this->descriptor_;
  if (0 < *(int *)(pDVar6 + 0x7c)) {
    local_50 = (vector<google::protobuf::compiler::cpp::ExtensionGenerator_const*,std::allocator<google::protobuf::compiler::cpp::ExtensionGenerator_const*>>
                *)&this->extension_generators_;
    lVar8 = 0;
    lVar7 = 0;
    do {
      pEVar5 = (ExtensionGenerator *)operator_new(0x150);
      ExtensionGenerator::ExtensionGenerator
                (pEVar5,(FieldDescriptor *)(*(long *)(pDVar6 + 0x50) + lVar8),&this->options_,
                 this->scc_analyzer_);
      pvVar4 = local_38;
      __position_01._M_current =
           *(unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>
             **)(local_38 + 8);
      if (__position_01._M_current ==
          *(unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>
            **)(local_38 + 0x10)) {
        local_58._M_head_impl = pEVar5;
        std::
        vector<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>>>>
        ::_M_realloc_insert<google::protobuf::compiler::cpp::ExtensionGenerator*>
                  (local_38,__position_01,&local_58._M_head_impl);
      }
      else {
        ((__position_01._M_current)->_M_t).
        super___uniq_ptr_impl<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>
        ._M_t.
        super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>
        .super__Head_base<0UL,_google::protobuf::compiler::cpp::ExtensionGenerator_*,_false>.
        _M_head_impl = pEVar5;
        *(long *)(local_38 + 8) = *(long *)(local_38 + 8) + 8;
      }
      local_58._M_head_impl = *(ExtensionGenerator **)(*(long *)(pvVar4 + 8) + -8);
      __position_02._M_current =
           (this->extension_generators_).
           super__Vector_base<const_google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::allocator<const_google::protobuf::compiler::cpp::ExtensionGenerator_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position_02._M_current ==
          (this->extension_generators_).
          super__Vector_base<const_google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::allocator<const_google::protobuf::compiler::cpp::ExtensionGenerator_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<google::protobuf::compiler::cpp::ExtensionGenerator_const*,std::allocator<google::protobuf::compiler::cpp::ExtensionGenerator_const*>>
        ::_M_realloc_insert<google::protobuf::compiler::cpp::ExtensionGenerator_const*>
                  (local_50,__position_02,&local_58._M_head_impl);
      }
      else {
        *__position_02._M_current = local_58._M_head_impl;
        pppEVar3 = &(this->extension_generators_).
                    super__Vector_base<const_google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::allocator<const_google::protobuf::compiler::cpp::ExtensionGenerator_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppEVar3 = *pppEVar3 + 1;
      }
      lVar7 = lVar7 + 1;
      pDVar6 = this->descriptor_;
      lVar8 = lVar8 + 0x48;
    } while (lVar7 < *(int *)(pDVar6 + 0x7c));
  }
  return;
}

Assistant:

void MessageGenerator::AddGenerators(
    std::vector<std::unique_ptr<EnumGenerator>>* enum_generators,
    std::vector<std::unique_ptr<ExtensionGenerator>>* extension_generators) {
  for (int i = 0; i < descriptor_->enum_type_count(); i++) {
    enum_generators->emplace_back(
        new EnumGenerator(descriptor_->enum_type(i), variables_, options_));
    enum_generators_.push_back(enum_generators->back().get());
  }
  for (int i = 0; i < descriptor_->extension_count(); i++) {
    extension_generators->emplace_back(new ExtensionGenerator(
        descriptor_->extension(i), options_, scc_analyzer_));
    extension_generators_.push_back(extension_generators->back().get());
  }
}